

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precomputed_scalar_reference_finite_element.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::PrecomputedScalarReferenceFiniteElement<double>::GradientsReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,
          PrecomputedScalarReferenceFiniteElement<double> *this,MatrixXd *local)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (this->fe_ != (ScalarReferenceFiniteElement<double> *)0x0) {
    (*this->fe_->_vptr_ScalarReferenceFiniteElement[8])();
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Not initialized.",0x10);
  paVar1 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"fe_ != nullptr","");
  paVar2 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e8,&local_208,0x79,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  local_1e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"false","");
  local_208._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/precomputed_scalar_reference_finite_element.h"
             ,"");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  base::AssertionFailed(&local_1e8,&local_208,0x79,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  GradientsReferenceShapeFunctions(
      const Eigen::MatrixXd& local) const override {
    LF_ASSERT_MSG(fe_ != nullptr, "Not initialized.");
    return fe_->GradientsReferenceShapeFunctions(local);
  }